

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O1

bool __thiscall ADSBBase::ProcessFetchedData(ADSBBase *this)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  JSON_Value *value;
  JSON_Object *pJVar4;
  JSON_Array *array;
  size_t sVar5;
  char *__s;
  bool bVar6;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar7;
  FDKeyType _eType;
  ulong index;
  bool bVar8;
  double dVar9;
  string hexKey;
  FDKeyTy fdKey;
  string acFilter;
  positionTy viewPos;
  long *local_140;
  char *local_138;
  long local_130 [2];
  undefined1 local_120 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f0;
  double local_d0;
  long *local_c8;
  size_t local_c0;
  long local_b8 [2];
  string local_a8;
  double local_88;
  undefined1 local_78 [72];
  
  if (((this->super_LTFlightDataChannel).super_LTOnlineChannel.httpResponse | 2U) == 0x193) {
    if ((int)dataRefs.iLogLevel < 4) {
      sVar5 = (this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos;
      if (sVar5 == 0) {
        pcVar7 = "";
      }
      else {
        FetchMsg_abi_cxx11_((string *)local_78,
                            (ADSBBase *)
                            (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData,in_RDX);
        pcVar7 = (char *)local_78._0_8_;
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x3a,"ProcessFetchedData",logERR,"ADS-B Exchange: API Key test FAILED: %s",pcVar7);
      in_RDX = extraout_RDX;
      if ((sVar5 != 0) && ((undefined1 *)local_78._0_8_ != local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        in_RDX = extraout_RDX_00;
      }
    }
    sVar5 = (this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos;
    if (sVar5 == 0) {
      pcVar7 = "";
    }
    else {
      FetchMsg_abi_cxx11_((string *)local_120,
                          (ADSBBase *)
                          (this->super_LTFlightDataChannel).super_LTOnlineChannel.netData,in_RDX);
      pcVar7 = (char *)local_120._0_8_;
    }
    CreateMsgWindow(12.0,logERR,"ADS-B Exchange: API Key test FAILED: %s",pcVar7);
    if ((sVar5 != 0) && ((undefined1 *)local_120._0_8_ != local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[7])
              (this,0,1);
    return false;
  }
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.netDataPos == 0) {
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
    return false;
  }
  value = json_parse_string((char *)0x146ffe);
  if (value == (JSON_Value *)0x0) {
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
             ,0x48,"ProcessFetchedData",logERR,"Parsing flight data as JSON failed");
    }
    (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
              (this);
  }
  else {
    pJVar4 = json_object(value);
    if (pJVar4 == (JSON_Object *)0x0) {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
               ,0x4c,"ProcessFetchedData",logERR,"JSON: Getting main object failed");
      }
      (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel[8])
                (this);
    }
    else {
      iVar2 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[0x16])(this,pJVar4);
      if ((char)iVar2 != '\0') {
        DataRefs::GetViewPos();
        dVar9 = jog_n_nan(pJVar4,"now");
        if (NAN(dVar9)) {
          dVar9 = json_object_dotget_number(pJVar4,"ctime");
        }
        local_88 = (double)(~-(ulong)(70000000000.0 < dVar9) & (ulong)dVar9 |
                           (ulong)(dVar9 / 1000.0) & -(ulong)(70000000000.0 < dVar9));
        if (1546344000.0 < local_88) {
          DataRefs::ChTsOffsetAdd(&dataRefs,local_88);
        }
        local_d0 = (double)dataRefs.fdBufPeriod;
        DataRefs::GetDebugAcFilter_abi_cxx11_(&local_a8,&dataRefs);
        array = json_object_get_array(pJVar4,"ac");
        if (array == (JSON_Array *)0x0) {
          array = json_object_get_array(pJVar4,"aircraft");
        }
        bVar6 = true;
        if (array != (JSON_Array *)0x0) {
          index = 0;
          do {
            sVar5 = json_array_get_count(array);
            if (sVar5 <= index) break;
            pJVar4 = json_array_get_object(array,index);
            if (pJVar4 == (JSON_Object *)0x0) {
              if ((int)dataRefs.iLogLevel < 4) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                       ,0x72,"ProcessFetchedData",logERR,
                       "JSON: Could not get %lu. aircraft in \'%s\'",index + 1,"ac");
              }
              uVar3 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                        _vptr_LTChannel[8])(this);
              uVar3 = (uVar3 & 0xff) * 3 + 1;
            }
            else {
              pcVar7 = jog_s(pJVar4,"hex");
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_140,pcVar7,(allocator<char> *)local_120);
              if (local_138 == (char *)0x0) {
                __s = jog_s(pJVar4,"icao");
                pcVar7 = local_138;
                strlen(__s);
                std::__cxx11::string::_M_replace((ulong)&local_140,0,pcVar7,(ulong)__s);
                if (local_138 == (char *)0x0) {
                  uVar3 = 0;
                }
                else {
                  if ((int)dataRefs.iLogLevel < 3) {
                    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBEx.cpp"
                           ,0x81,"ProcessFetchedData",logWARN,
                           "%s: Received data looks like ADSBEx v1, which is no longer supported!",
                           (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                           pszChName);
                  }
                  uVar3 = 1;
                  (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                    _vptr_LTChannel[8])(this);
                }
              }
              else {
                _eType = KEY_ICAO;
                if ((char)*local_140 == '~') {
                  _eType = KEY_ADSBEX;
                  std::__cxx11::string::erase((ulong)&local_140,0);
                }
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f0,local_140,local_138 + (long)local_140);
                LTFlightData::FDKeyTy::FDKeyTy((FDKeyTy *)local_120,_eType,&local_f0,0x10);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                sVar1 = local_a8._M_string_length;
                if (local_a8._M_string_length == 0) {
LAB_00147337:
                  bVar8 = false;
                }
                else {
                  local_c8 = local_b8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_c8,local_a8._M_dataplus._M_p,
                             local_a8._M_dataplus._M_p + local_a8._M_string_length);
                  bVar8 = true;
                  if (local_120._16_8_ == local_c0) {
                    if (local_120._16_8_ == 0) goto LAB_00147337;
                    iVar2 = bcmp((void *)local_120._8_8_,local_c8,local_120._16_8_);
                    bVar8 = iVar2 != 0;
                  }
                }
                if ((sVar1 != 0) && (local_c8 != local_b8)) {
                  operator_delete(local_c8,local_b8[0] + 1);
                }
                uVar3 = 0;
                if (!bVar8) {
                  ProcessV2(this,pJVar4,(FDKeyTy *)local_120,local_d0,local_88,
                            (positionTy *)local_78);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._8_8_ != &local_108) {
                  operator_delete((void *)local_120._8_8_,local_108._M_allocated_capacity + 1);
                }
              }
              if (local_140 != local_130) {
                operator_delete(local_140,local_130[0] + 1);
              }
            }
            if ((uVar3 & 3) != 0) {
              bVar6 = false;
              break;
            }
            index = index + 1;
          } while (array != (JSON_Array *)0x0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00147614;
      }
    }
  }
  bVar6 = false;
LAB_00147614:
  if (value != (JSON_Value *)0x0) {
    json_value_free(value);
  }
  return bVar6;
}

Assistant:

bool ADSBBase::ProcessFetchedData ()
{
    // received an UNAUTHOIZRED response? Then the key is invalid!
    if (httpResponse == HTTP_UNAUTHORIZED || httpResponse == HTTP_FORBIDDEN) {
        SHOW_MSG(logERR, ERR_ADSBEX_KEY_FAILED,
                 netDataPos ? FetchMsg(netData).c_str() : "");
        SetValid(false);
        return false;
    }

    // data is expected to be in netData string
    // short-cut if there is nothing
    if ( !netDataPos ) {
        IncErrCnt();
        return false;
    }
    
    // now try to interpret it as JSON
    JSONRootPtr pRoot (netData);
    if (!pRoot) { LOG_MSG(logERR,ERR_JSON_PARSE); IncErrCnt(); return false; }
    
    // first get the structre's main object
    JSON_Object* pObj = json_object(pRoot.get());
    if (!pObj) { LOG_MSG(logERR,ERR_JSON_MAIN_OBJECT); IncErrCnt(); return false; }
    
    // Test for any channel-specific errors
    if (!ProcessErrors(pObj)) return false;
    
    // We need to calculate distance to current camera later on
    const positionTy viewPos = dataRefs.GetViewPos();
    
    // for determining an offset as compared to network time we need to know network time
    // Also used later to calcualte the position's timestamp
    double adsbxTime = jog_n_nan(pObj, ADSBEX_NOW);
    if (std::isnan(adsbxTime))
        adsbxTime = jog_n(pObj, ADSBEX_TIME);
    // Convert a timestamp in milliseconds to a timestamp in seconds
    if (adsbxTime > 70000000000.0)
        adsbxTime /= 1000.0;
    
    // if reasonable add this to our time offset calculation
    if (adsbxTime > JAN_FIRST_2019)
        dataRefs.ChTsOffsetAdd(adsbxTime);
    
    // Cut-off time: We ignore tracking data, which is older than our buffering time
    const double tBufPeriod = (double) dataRefs.GetFdBufPeriod();
    
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // let's cycle the aircraft
    // fetch the aircraft array, adsb.fi defines a different aircraft key unfortunately
    JSON_Array* pJAcList = json_object_get_array(pObj, ADSBEX_AIRCRAFT_ARR);
    if (!pJAcList)
        pJAcList = json_object_get_array(pObj, ADSBFI_AIRCRAFT_ARR);
    // iterate all aircraft in the received flight data (can be 0 or even pJAcList == NULL!)
    for ( size_t i=0; pJAcList && (i < json_array_get_count(pJAcList)); i++ )
    {
        // get the aircraft
        JSON_Object* pJAc = json_array_get_object(pJAcList,i);
        if (!pJAc) {
            LOG_MSG(logERR,ERR_JSON_AC,i+1,ADSBEX_AIRCRAFT_ARR);
            if (IncErrCnt())
                continue;
            else
                return false;
        }
        
        // try version 2 first
        std::string hexKey = jog_s(pJAc, ADSBEX_V2_TRANSP_ICAO);
        if (hexKey.empty()) {
            // not found, try version 1
            hexKey = jog_s(pJAc, ADSBEX_V1_TRANSP_ICAO);
            if (!hexKey.empty()) {
                // Hm...this could be v1 data...since v4.2 we don't process that any longer
                LOG_MSG(logWARN, "%s: Received data looks like ADSBEx v1, which is no longer supported!",
                        ChName());
                IncErrCnt();
                return false;
            }
            // Either way, this can't be processed
            continue;
        }
        
        // the key: transponder Icao code or some other code
        LTFlightData::FDKeyType keyType = LTFlightData::KEY_ICAO;
        if (hexKey.front() == '~') {        // key is a non-icao code?
            hexKey.erase(0, 1);             // remove the ~
            keyType = LTFlightData::KEY_ADSBEX;
        }
        LTFlightData::FDKeyTy fdKey (keyType, hexKey);
        
        // not matching a/c filter? -> skip it
        if (!acFilter.empty() && (fdKey != acFilter))
            continue;

        // Process the details
        try {
            ProcessV2(pJAc, fdKey, tBufPeriod, adsbxTime, viewPos);
        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
        } catch(...) {
            LOG_MSG(logERR, "Exception while processing data for '%s'", hexKey.c_str());
        }
    }
    
    // success
    return true;
}